

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Msg.cpp
# Opt level: O2

Msg * __thiscall util::logging::Msg::operator+(Msg *__return_storage_ptr__,Msg *this,double val)

{
  double *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  double local_28;
  double val_local;
  
  local_28 = val;
  boost::lexical_cast<std::__cxx11::string,double>(&local_48,(boost *)&local_28,in_RDX);
  operator+(__return_storage_ptr__,this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

Msg Msg::operator+( double val)
		{
			return operator+( boost::lexical_cast<std::string>(val) );
		}